

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  uint uVar1;
  FileStream *this;
  Engine *pEVar2;
  IGlobalFunction *globalFunction;
  Object **args_00;
  ObjectInt *this_00;
  Object **args;
  uint argc;
  uint local_60;
  allocator local_59;
  uint myTestFunctionName;
  uint local_34;
  Engine *pEStack_30;
  uint testFunctionName;
  Engine *engine;
  FileStream *local_18;
  Stream *stream;
  
  stream._4_4_ = 0;
  this = (FileStream *)operator_new(0x10);
  FileStream::FileStream(this,"test.script");
  local_18 = this;
  pEVar2 = (Engine *)operator_new(0x70);
  Engine::Engine(pEVar2);
  pEStack_30 = pEVar2;
  Engine::loadCurrentScript(pEVar2,&local_18->super_Stream);
  if (local_18 != (FileStream *)0x0) {
    operator_delete(local_18);
  }
  pEVar2 = pEStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&myTestFunctionName,"test",&local_59);
  uVar1 = Engine::getGlobalFunctionNameByString(pEVar2,(string *)&myTestFunctionName);
  std::__cxx11::string::~string((string *)&myTestFunctionName);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pEVar2 = pEStack_30;
  local_34 = uVar1;
  globalFunction = (IGlobalFunction *)operator_new(8);
  globalFunction->_vptr_IGlobalFunction = (_func_int **)0x0;
  TestFunction::TestFunction((TestFunction *)globalFunction);
  Engine::setGlobalFunction(pEVar2,uVar1,globalFunction);
  Engine::executeCurrentScript(pEStack_30);
  pEVar2 = pEStack_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&argc,"myTestFunction",(allocator *)((long)&args + 7));
  uVar1 = Engine::getLocalFunctionNameByString(pEVar2,(string *)&argc);
  std::__cxx11::string::~string((string *)&argc);
  std::allocator<char>::~allocator((allocator<char> *)((long)&args + 7));
  args._0_4_ = 1;
  local_60 = uVar1;
  args_00 = (Object **)operator_new__(8);
  this_00 = (ObjectInt *)operator_new(0x10);
  ObjectInt::ObjectInt(this_00,0x18894);
  *args_00 = (Object *)this_00;
  Engine::executeLocalFunction(pEStack_30,local_60,args_00,(uint)args);
  pEVar2 = pEStack_30;
  if (pEStack_30 != (Engine *)0x0) {
    Engine::~Engine(pEStack_30);
    operator_delete(pEVar2);
  }
  return 0;
}

Assistant:

int main() {
	Stream* stream = new FileStream("test.script");
	Engine* engine = new Engine();
	
	engine->loadCurrentScript(stream);
	delete stream;
	
	unsigned int testFunctionName = engine->getGlobalFunctionNameByString("test");
	if (testFunctionName == Engine::CANT_FIND) {
		//do something
	}
	engine->setGlobalFunction(testFunctionName, new TestFunction());
	
	engine->executeCurrentScript();
	unsigned int myTestFunctionName = engine->getLocalFunctionNameByString("myTestFunction");
	
	unsigned int argc = 1;
	Object** args = new Object*[argc];
	args[0] = new ObjectInt(100500);
	engine->executeLocalFunction(myTestFunctionName, args, argc);
	
	delete engine;
	return 0;
}